

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

void __thiscall
miniros::Subscription::pendingConnectionDone
          (Subscription *this,PendingConnectionPtr *conn,XmlRpcValue *result)

{
  uint uVar1;
  uint uVar2;
  RPCManager *this_00;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  RPCManagerPtr *pRVar7;
  XmlRpcValue *pXVar8;
  string *psVar9;
  uint *puVar10;
  PollManagerPtr *pPVar11;
  ConnectionManagerPtr *pCVar12;
  ulong uVar13;
  BinaryData *__x;
  uchar *__p;
  socklen_t __len;
  sockaddr *__addr;
  XmlRpcValue proto;
  ConnectionPtr connection;
  string err;
  string pub_host;
  string proto_name;
  TransportUDPPtr udp_transport;
  TransportPublisherLinkPtr pub_link;
  shared_ptr<unsigned_char[]> buffer;
  TransportTCPPtr transport;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  TransportPublisherLinkPtr pub_link_1;
  Header h;
  ConnectionPtr connection_1;
  __shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  string xmlrpc_uri;
  string peer_host;
  stringstream ss;
  ostream local_1a8 [376];
  
  __len = (socklen_t)&proto;
  std::mutex::lock(&this->shutdown_mutex_);
  if ((this->shutting_down_ != false) || (this->dropped_ != false)) goto LAB_002527af;
  std::mutex::lock(&this->pending_connections_mutex_);
  std::
  _Rb_tree<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::shared_ptr<miniros::Subscription::PendingConnection>,_std::_Identity<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::erase(&(this->pending_connections_)._M_t,conn);
  pthread_mutex_unlock((pthread_mutex_t *)&this->pending_connections_mutex_);
  udp_transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  udp_transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string
            ((string *)&peer_host,
             (string *)
             &((conn->
               super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->client_->_host);
  uVar1 = ((conn->
           super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr)->client_->_port;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar6 = std::operator<<(local_1a8,"http://");
  poVar6 = std::operator<<(poVar6,(string *)&peer_host);
  poVar6 = std::operator<<(poVar6,":");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"/");
  std::__cxx11::stringbuf::str();
  std::__shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2> *)&proto_name,
             &(((conn->
                super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->udp_transport_).
              super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&udp_transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2> *)&proto_name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&proto_name._M_string_length);
  proto._type = TypeInvalid;
  proto._value.asDouble = 0.0;
  pRVar7 = RPCManager::instance();
  this_00 = (pRVar7->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&proto_name,"requestTopic",(allocator<char> *)&pub_host);
  bVar4 = RPCManager::validateXmlrpcResponse(this_00,&proto_name,result,&proto);
  std::__cxx11::string::~string((string *)&proto_name);
  if (bVar4) {
    iVar5 = XmlRpc::XmlRpcValue::size(&proto);
    if (iVar5 == 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&proto_name,"miniros.subscription",(allocator<char> *)&pub_host);
        console::initializeLogLocation
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,&proto_name,Debug);
        std::__cxx11::string::~string((string *)&proto_name);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,Debug);
        console::checkLogLocationEnabled
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.logger_,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x1dc,
                       "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                       ,"Couldn\'t agree on any common protocols with [%s] for topic [%s]",
                       xmlrpc_uri._M_dataplus._M_p,(this->name_)._M_dataplus._M_p);
      }
      goto LAB_00252760;
    }
    if (proto._type != TypeArray) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&proto_name,"miniros.subscription",(allocator<char> *)&pub_host);
        console::initializeLogLocation
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,&proto_name,Debug);
        std::__cxx11::string::~string((string *)&proto_name);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,Debug);
        console::checkLogLocationEnabled
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.logger_,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x1e3,
                       "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                       ,"Available protocol info returned from %s is not a list.",
                       xmlrpc_uri._M_dataplus._M_p);
      }
      goto LAB_00252760;
    }
    pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,0);
    if (pXVar8->_type != TypeString) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&proto_name,"miniros.subscription",(allocator<char> *)&pub_host);
        console::initializeLogLocation
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,&proto_name,Debug);
        std::__cxx11::string::~string((string *)&proto_name);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,Debug);
        console::checkLogLocationEnabled
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.logger_,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x1e9,
                       "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                       ,"Available protocol info list doesn\'t have a string as its first element.")
        ;
      }
      goto LAB_00252760;
    }
    pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,0);
    psVar9 = XmlRpc::XmlRpcValue::operator_cast_to_string_(pXVar8);
    std::__cxx11::string::string((string *)&proto_name,(string *)psVar9);
    bVar4 = std::operator==(&proto_name,"TCPROS");
    if (bVar4) {
      iVar5 = XmlRpc::XmlRpcValue::size(&proto);
      if (((iVar5 == 3) &&
          (pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,1), pXVar8->_type == TypeString)) &&
         (pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,2), pXVar8->_type == TypeInt)) {
        pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,1);
        psVar9 = XmlRpc::XmlRpcValue::operator_cast_to_string_(pXVar8);
        std::__cxx11::string::string((string *)&pub_host,(string *)psVar9);
        pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,2);
        puVar10 = (uint *)XmlRpc::XmlRpcValue::operator_cast_to_int_(pXVar8);
        __addr = (sockaddr *)(ulong)*puVar10;
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"miniros.subscription",(allocator<char> *)&transport);
          console::initializeLogLocation
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,&err,Debug);
          std::__cxx11::string::~string((string *)&err);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          __len = 0x29569b;
          console::print((FilterBase *)0x0,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.logger_,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x1fb,
                         "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                         ,"Connecting via tcpros to topic [%s] at host [%s:%d]",
                         (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,__addr);
        }
        pPVar11 = PollManager::instance();
        err._M_dataplus._M_p =
             (pointer)(pPVar11->super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
        std::make_shared<miniros::TransportTCP,miniros::PollSet*>((PollSet **)&transport);
        iVar5 = TransportTCP::connect
                          (transport.
                           super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(int)&pub_host,__addr,__len);
        if ((char)iVar5 == '\0') {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.initialized_ == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&err,"miniros.subscription",(allocator<char> *)&connection);
            console::initializeLogLocation
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,&err,Debug);
            std::__cxx11::string::~string((string *)&err);
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,Debug);
            console::checkLogLocationEnabled
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc);
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.logger_,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x20f,
                           "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                           ,"Failed to connect to publisher of topic [%s] at [%s:%d]",
                           (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,__addr);
          }
        }
        else {
          std::make_shared<miniros::Connection>();
          std::__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<miniros::Subscription,void>
                    ((__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2> *)&err,
                     (__weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)
                     &this->super_enable_shared_from_this<miniros::Subscription>);
          std::
          make_shared<miniros::TransportPublisherLink,std::shared_ptr<miniros::Subscription>,std::__cxx11::string&,miniros::TransportHints&>
                    ((shared_ptr<miniros::Subscription> *)&pub_link,&err,
                     (TransportHints *)&xmlrpc_uri);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&err._M_string_length);
          peVar3 = connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<miniros::TransportTCP,void>
                    ((__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> *)&buffer,
                     &transport.
                      super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>);
          err.field_2._M_allocated_capacity = 0;
          err.field_2._8_8_ = 0;
          err._M_dataplus._M_p = (pointer)0x0;
          err._M_string_length = 0;
          Connection::initialize(peVar3,(TransportPtr *)&buffer,false,(HeaderReceivedFunc *)&err);
          std::_Function_base::~_Function_base((_Function_base *)&err);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          TransportPublisherLink::initialize
                    ((TransportPublisherLink *)
                     CONCAT44(pub_link.
                              super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,
                              (int)pub_link.
                                   super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr),&connection);
          pCVar12 = ConnectionManager::instance();
          ConnectionManager::addConnection
                    ((pCVar12->
                     super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&connection);
          std::mutex::lock(&this->publisher_links_mutex_);
          std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<miniros::TransportPublisherLink,void>
                    ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)&err,
                     &pub_link.
                      super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                    );
          std::
          vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
          ::push_back(&this->publisher_links_,(value_type *)&err);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&err._M_string_length);
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.initialized_ == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&err,"miniros.subscription",(allocator<char> *)&buffer);
            console::initializeLogLocation
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,&err,Debug);
            std::__cxx11::string::~string((string *)&err);
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,Debug);
            console::checkLogLocationEnabled
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc);
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.logger_,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x20b,
                           "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                           ,"Connected to publisher of topic [%s] at [%s:%d]",
                           (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,__addr);
          }
          pthread_mutex_unlock((pthread_mutex_t *)&this->publisher_links_mutex_);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&pub_link.
                      super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
LAB_00252bce:
        std::__cxx11::string::~string((string *)&pub_host);
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pub_host,"miniros.subscription",(allocator<char> *)&err);
          console::initializeLogLocation
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,&pub_host,Debug);
          std::__cxx11::string::~string((string *)&pub_host);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.logger_,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x1f6,
                         "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                         ,"publisher implements TCPROS, but the parameters aren\'t string,int");
        }
      }
    }
    else {
      bVar4 = std::operator==(&proto_name,"UDPROS");
      if (bVar4) {
        iVar5 = XmlRpc::XmlRpcValue::size(&proto);
        if (((((iVar5 == 6) &&
              (pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,1), pXVar8->_type == TypeString)) &&
             (pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,2), pXVar8->_type == TypeInt)) &&
            ((pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,3), pXVar8->_type == TypeInt &&
             (pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,4), pXVar8->_type == TypeInt)))) &&
           (pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,5), pXVar8->_type == TypeBase64)) {
          pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,1);
          psVar9 = XmlRpc::XmlRpcValue::operator_cast_to_string_(pXVar8);
          std::__cxx11::string::string((string *)&pub_host,(string *)psVar9);
          pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,2);
          puVar10 = (uint *)XmlRpc::XmlRpcValue::operator_cast_to_int_(pXVar8);
          uVar13 = (ulong)*puVar10;
          pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,3);
          puVar10 = (uint *)XmlRpc::XmlRpcValue::operator_cast_to_int_(pXVar8);
          uVar1 = *puVar10;
          pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,4);
          puVar10 = (uint *)XmlRpc::XmlRpcValue::operator_cast_to_int_(pXVar8);
          uVar2 = *puVar10;
          pXVar8 = XmlRpc::XmlRpcValue::operator[](&proto,5);
          __x = XmlRpc::XmlRpcValue::operator_cast_to_vector_(pXVar8);
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&pub_link,__x);
          __p = (uchar *)operator_new__(CONCAT44(pub_link.
                                                 super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi._4_4_,
                                                 (int)pub_link.
                                                  super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi) -
                                        CONCAT44(pub_link.
                                                 super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr._4_4_,
                                                 (int)pub_link.
                                                  super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr));
          std::__shared_ptr<unsigned_char[],(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<unsigned_char,void>
                    ((__shared_ptr<unsigned_char[],(__gnu_cxx::_Lock_policy)2> *)&buffer,__p);
          memcpy(buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (void *)CONCAT44(pub_link.
                                  super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr._4_4_,
                                  (int)pub_link.
                                       super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr),
                 CONCAT44(pub_link.
                          super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_,
                          (int)pub_link.
                               super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi) -
                 (long)CONCAT44(pub_link.
                                super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr._4_4_,
                                (int)pub_link.
                                     super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr));
          Header::Header(&h);
          err._M_dataplus._M_p = (pointer)&err.field_2;
          err._M_string_length = 0;
          err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00
          ;
          bVar4 = Header::parse(&h,&buffer,
                                (int)pub_link.
                                     super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi -
                                (int)pub_link.
                                     super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,&err);
          if (bVar4) {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.initialized_ == false) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&transport,"miniros.subscription",(allocator<char> *)&connection)
              ;
              console::initializeLogLocation
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc,(string *)&transport,Debug);
              std::__cxx11::string::~string((string *)&transport);
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.level_ != Debug) {
              console::setLogLocationLevel
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc,Debug);
              console::checkLogLocationEnabled
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc);
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.logger_,
                             pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                             ,0x22f,
                             "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                             ,
                             "Connecting via udpros to topic [%s] at host [%s:%d] connection id [%08x] max_datagram_size [%d]"
                             ,(this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,uVar13,
                             (ulong)uVar1,(ulong)uVar2);
            }
            transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&local_248;
            transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_248._M_local_buf[0] = '\0';
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&connection,"error",(allocator<char> *)&pub_link_1);
            bVar4 = Header::getValue(&h,(string *)&connection,(string *)&transport);
            std::__cxx11::string::~string((string *)&connection);
            if (bVar4) {
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.initialized_ == false) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&connection,"miniros.subscription",
                           (allocator<char> *)&pub_link_1);
                console::initializeLogLocation
                          (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                            ::loc,(string *)&connection,Debug);
                std::__cxx11::string::~string((string *)&connection);
              }
              if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.level_ != Debug) {
                console::setLogLocationLevel
                          (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                            ::loc,Debug);
                console::checkLogLocationEnabled
                          (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                            ::loc);
              }
              if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.logger_enabled_ == true) {
                console::print((FilterBase *)0x0,
                               pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                               ::loc.logger_,
                               pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                               ::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                               ,0x234,
                               "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                               ,"Received error message in header for connection to [%s]: [%s]",
                               xmlrpc_uri._M_dataplus._M_p,
                               transport.
                               super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
              }
              if (udp_transport.
                  super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                (*((udp_transport.
                    super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_Transport)._vptr_Transport[8])();
              }
            }
            else {
              std::__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<miniros::Subscription,void>
                        ((__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2> *)
                         &connection,
                         (__weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)
                         &this->super_enable_shared_from_this<miniros::Subscription>);
              std::
              make_shared<miniros::TransportPublisherLink,std::shared_ptr<miniros::Subscription>,std::__cxx11::string&,miniros::TransportHints&>
                        ((shared_ptr<miniros::Subscription> *)&pub_link_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connection,(TransportHints *)&xmlrpc_uri);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&connection.
                          super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              bVar4 = PublisherLink::setHeader
                                (&(pub_link_1.
                                   super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_PublisherLink,&h);
              if (bVar4) {
                std::make_shared<miniros::Connection>();
                peVar3 = connection_1.
                         super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<miniros::TransportUDP,void>
                          (local_208,
                           &udp_transport.
                            super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>);
                connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                Connection::initialize
                          (peVar3,(TransportPtr *)local_208,false,(HeaderReceivedFunc *)&connection)
                ;
                std::_Function_base::~_Function_base((_Function_base *)&connection);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200);
                std::
                __shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ::operator=((__shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             *)&(connection_1.
                                 super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->header_,
                            (__shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             *)&h);
                TransportPublisherLink::initialize
                          (pub_link_1.
                           super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&connection_1);
                pCVar12 = ConnectionManager::instance();
                ConnectionManager::addConnection
                          ((pCVar12->
                           super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,&connection_1);
                std::mutex::lock(&this->publisher_links_mutex_);
                std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<miniros::TransportPublisherLink,void>
                          ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)
                           &connection,
                           &pub_link_1.
                            super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                          );
                std::
                vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                ::push_back(&this->publisher_links_,(value_type *)&connection);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&connection.
                            super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (console::g_initialized == '\0') {
                  console::initialize();
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.initialized_ == false) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&connection,"miniros.subscription",
                             (allocator<char> *)local_208);
                  console::initializeLogLocation
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc,(string *)&connection,Debug);
                  std::__cxx11::string::~string((string *)&connection);
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.level_ != Debug) {
                  console::setLogLocationLevel
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc,Debug);
                  console::checkLogLocationEnabled
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc);
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.logger_enabled_ == true) {
                  console::print((FilterBase *)0x0,
                                 pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.logger_,
                                 pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.level_,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                 ,0x246,
                                 "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                 ,"Connected to publisher of topic [%s] at [%s:%d]",
                                 (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,uVar13);
                }
                pthread_mutex_unlock((pthread_mutex_t *)&this->publisher_links_mutex_);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&connection_1.
                            super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              else {
                if (console::g_initialized == '\0') {
                  console::initialize();
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.initialized_ == false) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&connection,"miniros.subscription",
                             (allocator<char> *)&connection_1);
                  console::initializeLogLocation
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc,(string *)&connection,Debug);
                  std::__cxx11::string::~string((string *)&connection);
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.level_ != Debug) {
                  console::setLogLocationLevel
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc,Debug);
                  console::checkLogLocationEnabled
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc);
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.logger_enabled_ == true) {
                  console::print((FilterBase *)0x0,
                                 pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.logger_,
                                 pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.level_,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                 ,0x24a,
                                 "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                 ,"Failed to connect to publisher of topic [%s] at [%s:%d]",
                                 (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,uVar13);
                }
                if (udp_transport.
                    super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  (*((udp_transport.
                      super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Transport)._vptr_Transport[8])();
                }
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&pub_link_1.
                          super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
            std::__cxx11::string::~string((string *)&transport);
          }
          else {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.initialized_ == false) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&transport,"miniros.subscription",(allocator<char> *)&connection)
              ;
              console::initializeLogLocation
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc,(string *)&transport,Debug);
              std::__cxx11::string::~string((string *)&transport);
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.level_ != Debug) {
              console::setLogLocationLevel
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc,Debug);
              console::checkLogLocationEnabled
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc);
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.logger_,
                             pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                             ,0x22b,
                             "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                             ,"Unable to parse UDPROS connection header: %s",err._M_dataplus._M_p);
            }
            if (udp_transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              (*((udp_transport.
                  super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Transport)._vptr_Transport[8])();
            }
          }
          std::__cxx11::string::~string((string *)&err);
          Header::~Header(&h);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    ((_Vector_base<char,_std::allocator<char>_> *)&pub_link);
          goto LAB_00252bce;
        }
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pub_host,"miniros.subscription",(allocator<char> *)&err);
          console::initializeLogLocation
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,&pub_host,Debug);
          std::__cxx11::string::~string((string *)&pub_host);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.logger_,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x21c,
                         "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                         ,
                         "publisher implements UDPROS, but the parameters aren\'t string,int,int,int,base64"
                        );
        }
        if (udp_transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          (*((udp_transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_Transport)._vptr_Transport[8])();
        }
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pub_host,"miniros.subscription",(allocator<char> *)&err);
          console::initializeLogLocation
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,&pub_host,Debug);
          std::__cxx11::string::~string((string *)&pub_host);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.logger_,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x251,
                         "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                         ,"Publisher offered unsupported transport [%s]",proto_name._M_dataplus._M_p
                        );
        }
      }
    }
    std::__cxx11::string::~string((string *)&proto_name);
  }
  else {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (pendingConnectionDone::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&proto_name,"miniros.subscription",(allocator<char> *)&pub_host);
      console::initializeLogLocation(&pendingConnectionDone::loc,&proto_name,Debug);
      std::__cxx11::string::~string((string *)&proto_name);
    }
    if (pendingConnectionDone::loc.level_ != Debug) {
      console::setLogLocationLevel(&pendingConnectionDone::loc,Debug);
      console::checkLogLocationEnabled(&pendingConnectionDone::loc);
    }
    if (pendingConnectionDone::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,pendingConnectionDone::loc.logger_,
                     pendingConnectionDone::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0x1d5,
                     "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                     ,"Failed to contact publisher [%s:%d] for topic [%s]",
                     peer_host._M_dataplus._M_p,(ulong)uVar1,(this->name_)._M_dataplus._M_p);
    }
LAB_00252760:
    if (udp_transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (*((udp_transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_Transport)._vptr_Transport[8])();
    }
  }
  XmlRpc::XmlRpcValue::~XmlRpcValue(&proto);
  std::__cxx11::string::~string((string *)&xmlrpc_uri);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&peer_host);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&udp_transport.super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_002527af:
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutdown_mutex_);
  return;
}

Assistant:

void Subscription::pendingConnectionDone(const PendingConnectionPtr& conn, XmlRpcValue& result)
{
  std::scoped_lock<std::mutex> lock(shutdown_mutex_);
  if (shutting_down_ || dropped_)
  {
    return;
  }

  {
    std::scoped_lock<std::mutex> pending_connections_lock(pending_connections_mutex_);
    pending_connections_.erase(conn);
  }

  TransportUDPPtr udp_transport;

  std::string peer_host = conn->getClient()->getHost();
  uint32_t peer_port = conn->getClient()->getPort();
  std::stringstream ss;
  ss << "http://" << peer_host << ":" << peer_port << "/";
  std::string xmlrpc_uri = ss.str();
  udp_transport = conn->getUDPTransport();

  XmlRpc::XmlRpcValue proto;
  if(!RPCManager::instance()->validateXmlrpcResponse("requestTopic", result, proto))
  {
  	MINIROS_DEBUG("Failed to contact publisher [%s:%d] for topic [%s]",
              peer_host.c_str(), peer_port, name_.c_str());
  	closeTransport(udp_transport);
  	return;
  }

  if (proto.size() == 0)
  {
  	MINIROS_DEBUG("Couldn't agree on any common protocols with [%s] for topic [%s]", xmlrpc_uri.c_str(), name_.c_str());
  	closeTransport(udp_transport);
  	return;
  }

  if (proto.getType() != XmlRpcValue::TypeArray)
  {
  	MINIROS_DEBUG("Available protocol info returned from %s is not a list.", xmlrpc_uri.c_str());
  	closeTransport(udp_transport);
  	return;
  }
  if (proto[0].getType() != XmlRpcValue::TypeString)
  {
  	MINIROS_DEBUG("Available protocol info list doesn't have a string as its first element.");
  	closeTransport(udp_transport);
  	return;
  }

  std::string proto_name = proto[0];
  if (proto_name == "TCPROS")
  {
    if (proto.size() != 3 ||
        proto[1].getType() != XmlRpcValue::TypeString ||
        proto[2].getType() != XmlRpcValue::TypeInt)
    {
        MINIROS_DEBUG("publisher implements TCPROS, but the " \
                "parameters aren't string,int");
      return;
    }
    std::string pub_host = proto[1];
    int pub_port = proto[2];
    MINIROS_DEBUG("Connecting via tcpros to topic [%s] at host [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);

    TransportTCPPtr transport(std::make_shared<TransportTCP>(&PollManager::instance()->getPollSet()));
    if (transport->connect(pub_host, pub_port))
    {
      ConnectionPtr connection(std::make_shared<Connection>());
      TransportPublisherLinkPtr pub_link(std::make_shared<TransportPublisherLink>(shared_from_this(), xmlrpc_uri, transport_hints_));

      connection->initialize(transport, false, HeaderReceivedFunc());
      pub_link->initialize(connection);

      ConnectionManager::instance()->addConnection(connection);

      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
      addPublisherLink(pub_link);

      MINIROS_DEBUG("Connected to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
    }
    else
    {
      MINIROS_DEBUG("Failed to connect to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
    }
  }
  else if (proto_name == "UDPROS")
  {
    if (proto.size() != 6 ||
        proto[1].getType() != XmlRpcValue::TypeString ||
        proto[2].getType() != XmlRpcValue::TypeInt ||
        proto[3].getType() != XmlRpcValue::TypeInt ||
        proto[4].getType() != XmlRpcValue::TypeInt ||
        proto[5].getType() != XmlRpcValue::TypeBase64)
    {
      MINIROS_DEBUG("publisher implements UDPROS, but the " \
	    	       "parameters aren't string,int,int,int,base64");
      closeTransport(udp_transport);
      return;
    }
    std::string pub_host = proto[1];
    int pub_port = proto[2];
    int conn_id = proto[3];
    int max_datagram_size = proto[4];
    std::vector<char> header_bytes = proto[5];
    std::shared_ptr<uint8_t[]> buffer(new uint8_t[header_bytes.size()]);
    memcpy(buffer.get(), &header_bytes[0], header_bytes.size());
    Header h;
    std::string err;
    if (!h.parse(buffer, header_bytes.size(), err))
    {
      MINIROS_DEBUG("Unable to parse UDPROS connection header: %s", err.c_str());
      closeTransport(udp_transport);
      return;
    }
    MINIROS_DEBUG("Connecting via udpros to topic [%s] at host [%s:%d] connection id [%08x] max_datagram_size [%d]", name_.c_str(), pub_host.c_str(), pub_port, conn_id, max_datagram_size);

    std::string error_msg;
    if (h.getValue("error", error_msg))
    {
      MINIROS_DEBUG("Received error message in header for connection to [%s]: [%s]", xmlrpc_uri.c_str(), error_msg.c_str());
      closeTransport(udp_transport);
      return;
    }

    TransportPublisherLinkPtr pub_link(std::make_shared<TransportPublisherLink>(shared_from_this(), xmlrpc_uri, transport_hints_));
    if (pub_link->setHeader(h))
    {
      ConnectionPtr connection(std::make_shared<Connection>());
      connection->initialize(udp_transport, false, NULL);
      connection->setHeader(h);
      pub_link->initialize(connection);

      ConnectionManager::instance()->addConnection(connection);

      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
      addPublisherLink(pub_link);

      MINIROS_DEBUG("Connected to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
    }
    else
    {
      MINIROS_DEBUG("Failed to connect to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
      closeTransport(udp_transport);
      return;
    }
  }
  else
  {
  	MINIROS_DEBUG("Publisher offered unsupported transport [%s]", proto_name.c_str());
  }
}